

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall
Lowerer::GenerateProfiledNewScIntArrayFastPath
          (Lowerer *this,Instr *instr,ArrayCallSiteInfo *arrayInfo,intptr_t arrayInfoAddr,
          intptr_t weakFuncRef)

{
  Opnd *pOVar1;
  Func *func;
  _func_int **pp_Var2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  undefined4 *puVar6;
  LabelInstr *helperLabel;
  RegOpnd *opnd;
  AddrOpnd *pAVar7;
  IndirOpnd *pIVar8;
  RegOpnd *pRVar9;
  LabelInstr *target;
  ArrayCallSiteInfo *arrayInfo_00;
  uint uVar10;
  Instr *pIVar11;
  ulong uVar12;
  int iVar13;
  undefined1 local_98 [8];
  AutoReuseOpnd autoReuseHeadOpnd;
  AutoReuseOpnd autoReuseDstElementsOpnd;
  uint local_44;
  Instr *pIStack_40;
  uint32 size;
  bool local_31 [8];
  bool isHeadSegmentZeroed;
  
  pIStack_40 = instr;
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar4 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015bbe90,ArrayLiteralFastPathPhase,sourceContextId,functionId);
  if ((((!bVar4) && (DAT_015b5f99 == '\0')) && (((arrayInfo->field_0).bits & 1) == 0)) &&
     (bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeArrayPhase), !bVar4)) {
    pOVar1 = pIStack_40->m_src1;
    OVar5 = IR::Opnd::GetKind(pOVar1);
    if (OVar5 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
      if (!bVar4) goto LAB_005cb398;
      *puVar6 = 0;
    }
    if (*(byte *)((long)&pOVar1[2].m_valueType.field_0.bits + 1) != 0x20) {
      return;
    }
    func = this->m_func;
    helperLabel = IR::LabelInstr::New(Label,func,true);
    pIVar11 = pIStack_40;
    GenerateArrayInfoIsNativeIntArrayTest(this,pIStack_40,arrayInfo_00,arrayInfoAddr,helperLabel);
    pOVar1 = pIVar11->m_src1;
    OVar5 = IR::Opnd::GetKind(pOVar1);
    if (OVar5 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
      if (!bVar4) goto LAB_005cb398;
      *puVar6 = 0;
    }
    pp_Var2 = pOVar1[1]._vptr_Opnd;
    local_44 = *(uint *)pp_Var2;
    pRVar9 = (RegOpnd *)pIVar11->m_dst;
    OVar5 = IR::Opnd::GetKind((Opnd *)pRVar9);
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_005cb398;
      *puVar6 = 0;
      pIVar11 = pIStack_40;
    }
    opnd = GenerateArrayAllocHelper<Js::JavascriptNativeIntArray>
                     (this,pIVar11,&local_44,arrayInfo,local_31,false,false);
    local_98 = (undefined1  [8])0x0;
    IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_98,&opnd->super_Opnd,func,true);
    pAVar7 = IR::AddrOpnd::New(weakFuncRef,AddrOpndKindDynamicMisc,this->m_func,false,(Var)0x0);
    pIVar8 = IR::IndirOpnd::New(pRVar9,0x38,(pAVar7->super_Opnd).m_type,this->m_func,false);
    InsertMove(&pIVar8->super_Opnd,&pAVar7->super_Opnd,pIVar11,true);
    if (*(uint *)pp_Var2 < 0x11) {
      if (*(uint *)pp_Var2 == 0) {
        uVar12 = 0;
      }
      else {
        iVar13 = 0x18;
        uVar12 = 0;
        do {
          GenerateMemInit(this,opnd,iVar13,*(uint *)((long)pp_Var2 + (uVar12 + 1) * 4),pIStack_40,
                          local_31[0]);
          uVar12 = uVar12 + 1;
          iVar13 = iVar13 + 4;
        } while (uVar12 < *(uint *)pp_Var2);
      }
    }
    else {
      pRVar9 = IR::RegOpnd::New(TyUint64,func);
      autoReuseHeadOpnd.autoDelete = false;
      autoReuseHeadOpnd.wasInUse = false;
      autoReuseHeadOpnd._18_6_ = 0;
      IR::AutoReuseOpnd::Initialize
                ((AutoReuseOpnd *)&autoReuseHeadOpnd.autoDelete,&pRVar9->super_Opnd,func,true);
      pAVar7 = IR::AddrOpnd::New((long)pOVar1[2]._vptr_Opnd + 4,AddrOpndKindDynamicMisc,func,false,
                                 (Var)0x0);
      pIVar8 = IR::IndirOpnd::New(opnd,0x18,TyUint64,func,false);
      InsertLea(pRVar9,&pIVar8->super_Opnd,pIStack_40);
      GenerateMemCopy(this,&pRVar9->super_Opnd,&pAVar7->super_Opnd,*(uint *)pp_Var2 << 2,pIStack_40)
      ;
      uVar12 = (ulong)*(uint *)pp_Var2;
      IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseHeadOpnd.autoDelete);
    }
    uVar10 = (uint)uVar12;
    if (uVar10 != *(uint *)pp_Var2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x109b,"(i == ints->count)","i == ints->count");
      if (!bVar4) {
LAB_005cb398:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    if (uVar10 < local_44) {
      iVar13 = uVar10 * 4 + 0x18;
      do {
        GenerateMemInit(this,opnd,iVar13,-0x7fffe,pIStack_40,local_31[0]);
        uVar10 = (int)uVar12 + 1;
        uVar12 = (ulong)uVar10;
        iVar13 = iVar13 + 4;
      } while (uVar10 < local_44);
    }
    target = IR::LabelInstr::New(Label,func,false);
    pIVar11 = pIStack_40;
    InsertBranch(Br,false,target,pIStack_40);
    IR::Instr::InsertBefore(pIVar11,&helperLabel->super_Instr);
    IR::Instr::InsertAfter(pIVar11,&target->super_Instr);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_98);
  }
  return;
}

Assistant:

void
Lowerer::GenerateProfiledNewScIntArrayFastPath(IR::Instr *instr, Js::ArrayCallSiteInfo * arrayInfo, intptr_t arrayInfoAddr, intptr_t weakFuncRef)
{
    // Helper will deal with ForceES5ARray
    if (PHASE_OFF(Js::ArrayLiteralFastPathPhase, m_func) || CONFIG_FLAG(ForceES5Array))
    {
        return;
    }

    if (!arrayInfo->IsNativeIntArray())
    {
        return;
    }

    if (instr->GetSrc1()->AsAddrOpnd()->GetAddrOpndKind() != IR::AddrOpndKindDynamicAuxBufferRef)
    {
        return;
    }

    Func * func = this->m_func;
    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true);

    GenerateArrayInfoIsNativeIntArrayTest(instr, arrayInfo, arrayInfoAddr, helperLabel);

    IR::AddrOpnd * elementsOpnd = instr->GetSrc1()->AsAddrOpnd();
    Js::AuxArray<int32> * ints = (Js::AuxArray<int32> *)elementsOpnd->m_metadata;
    uint32 size = ints->count;

    // Generate code as in JavascriptArray::NewLiteral
    bool isHeadSegmentZeroed;
    IR::RegOpnd * dstOpnd = instr->GetDst()->AsRegOpnd();
    Assert(Js::JavascriptNativeIntArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeIntArray::GetOffsetOfArrayCallSiteIndex());
    IR::RegOpnd * headOpnd = GenerateArrayLiteralsAlloc<Js::JavascriptNativeIntArray>(instr, &size, arrayInfo, &isHeadSegmentZeroed);
    const IR::AutoReuseOpnd autoReuseHeadOpnd(headOpnd, func);

    GenerateMemInit(dstOpnd, Js::JavascriptNativeIntArray::GetOffsetOfWeakFuncRef(), IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicMisc, m_func), instr, isHeadSegmentZeroed);

    // Initialize the elements
    uint i = 0;
    if (ints->count > 16)
    {
        // Do memcpy if > 16
        IR::RegOpnd * dstElementsOpnd = IR::RegOpnd::New(TyMachPtr, func);
        const IR::AutoReuseOpnd autoReuseDstElementsOpnd(dstElementsOpnd, func);
        IR::Opnd * srcOpnd = IR::AddrOpnd::New((intptr_t)elementsOpnd->m_address + Js::AuxArray<int32>::OffsetOfElements(), IR::AddrOpndKindDynamicMisc, func);
        InsertLea(dstElementsOpnd, IR::IndirOpnd::New(headOpnd, sizeof(Js::SparseArraySegmentBase), TyMachPtr, func), instr);
        GenerateMemCopy(dstElementsOpnd, srcOpnd, ints->count * sizeof(int32), instr);
        i = ints->count;
    }
    else
    {
        for (; i < ints->count; i++)
        {
            GenerateMemInit(headOpnd, sizeof(Js::SparseArraySegmentBase) + i * sizeof(int32),
                ints->elements[i], instr, isHeadSegmentZeroed);
        }
    }
    Assert(i == ints->count);
    for (; i < size; i++)
    {
        GenerateMemInit(headOpnd, sizeof(Js::SparseArraySegmentBase) + i * sizeof(int32),
            Js::JavascriptNativeIntArray::MissingItem, instr, isHeadSegmentZeroed);
    }
    // Skip pass the helper call
    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
    InsertBranch(Js::OpCode::Br, doneLabel, instr);
    instr->InsertBefore(helperLabel);

    instr->InsertAfter(doneLabel);
}